

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTessellationShaderInvariance.cpp
# Opt level: O1

int __thiscall
glcts::TessellationShaderInvarianceTests::init
          (TessellationShaderInvarianceTests *this,EVP_PKEY_CTX *ctx)

{
  ExtParameters *extParam;
  int extraout_EAX;
  TestCaseBase *pTVar1;
  
  pTVar1 = (TestCaseBase *)operator_new(0x2e0);
  extParam = &(this->super_TestCaseGroupBase).m_extParams;
  TestCaseBase::TestCaseBase
            (pTVar1,(this->super_TestCaseGroupBase).m_context,extParam,"invariance_rule1",
             "Verifies conformance with first invariance rule");
  pTVar1[1].super_TestCase.super_TestNode._vptr_TestNode = (_func_int **)0x0;
  *(undefined4 *)&pTVar1[1].super_TestCase.super_TestNode.m_testCtx = 0;
  pTVar1[1].super_TestCase.super_TestNode.m_name._M_dataplus._M_p = (pointer)0x0;
  pTVar1[1].super_TestCase.super_TestNode.m_name._M_string_length = 0;
  pTVar1[1].super_TestCase.super_TestNode.m_name.field_2._M_allocated_capacity = 0;
  *(undefined8 *)((long)&pTVar1[1].super_TestCase.super_TestNode.m_name.field_2 + 8) = 0;
  (pTVar1->super_TestCase).super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__TessellationShaderInvarianceRule1Test_02159168;
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar1);
  pTVar1 = (TestCaseBase *)operator_new(0x2f0);
  TestCaseBase::TestCaseBase
            (pTVar1,(this->super_TestCaseGroupBase).m_context,extParam,"invariance_rule2",
             "Verifies conformance with second invariance rule");
  pTVar1[1].super_TestCase.super_TestNode._vptr_TestNode = (_func_int **)0x0;
  *(undefined4 *)&pTVar1[1].super_TestCase.super_TestNode.m_testCtx = 0;
  pTVar1[1].super_TestCase.super_TestNode.m_name._M_dataplus._M_p = (pointer)0x0;
  pTVar1[1].super_TestCase.super_TestNode.m_name._M_string_length = 0;
  pTVar1[1].super_TestCase.super_TestNode.m_name.field_2._M_allocated_capacity = 0;
  *(undefined8 *)((long)&pTVar1[1].super_TestCase.super_TestNode.m_name.field_2 + 8) = 0;
  (pTVar1->super_TestCase).super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__TessellationShaderInvarianceRule2Test_02159208;
  pTVar1[1].super_TestCase.super_TestNode.m_description._M_dataplus._M_p = (pointer)0x0;
  pTVar1[1].super_TestCase.super_TestNode.m_description._M_string_length = 0;
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar1);
  pTVar1 = (TestCaseBase *)operator_new(0x2f8);
  TestCaseBase::TestCaseBase
            (pTVar1,(this->super_TestCaseGroupBase).m_context,extParam,"invariance_rule3",
             "Verifies conformance with third invariance rule");
  pTVar1[1].super_TestCase.super_TestNode._vptr_TestNode = (_func_int **)0x0;
  *(undefined4 *)&pTVar1[1].super_TestCase.super_TestNode.m_testCtx = 0;
  pTVar1[1].super_TestCase.super_TestNode.m_name._M_dataplus._M_p = (pointer)0x0;
  pTVar1[1].super_TestCase.super_TestNode.m_name._M_string_length = 0;
  pTVar1[1].super_TestCase.super_TestNode.m_name.field_2._M_allocated_capacity = 0;
  *(undefined8 *)((long)&pTVar1[1].super_TestCase.super_TestNode.m_name.field_2 + 8) = 0;
  (pTVar1->super_TestCase).super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__TessellationShaderInvarianceRule3Test_021592a8;
  pTVar1[1].super_TestCase.super_TestNode.m_description._M_dataplus._M_p = (pointer)0x0;
  pTVar1[1].super_TestCase.super_TestNode.m_description._M_string_length = 0;
  pTVar1[1].super_TestCase.super_TestNode.m_description.field_2._M_allocated_capacity = 0;
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar1);
  pTVar1 = (TestCaseBase *)operator_new(0x2f8);
  TestCaseBase::TestCaseBase
            (pTVar1,(this->super_TestCaseGroupBase).m_context,extParam,"invariance_rule4",
             "Verifies conformance with fourth invariance rule");
  pTVar1[1].super_TestCase.super_TestNode._vptr_TestNode = (_func_int **)0x0;
  *(undefined4 *)&pTVar1[1].super_TestCase.super_TestNode.m_testCtx = 0;
  pTVar1[1].super_TestCase.super_TestNode.m_name._M_dataplus._M_p = (pointer)0x0;
  pTVar1[1].super_TestCase.super_TestNode.m_name._M_string_length = 0;
  pTVar1[1].super_TestCase.super_TestNode.m_name.field_2._M_allocated_capacity = 0;
  *(undefined8 *)((long)&pTVar1[1].super_TestCase.super_TestNode.m_name.field_2 + 8) = 0;
  (pTVar1->super_TestCase).super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__TessellationShaderInvarianceRule4Test_02159348;
  pTVar1[1].super_TestCase.super_TestNode.m_description._M_dataplus._M_p = (pointer)0x0;
  pTVar1[1].super_TestCase.super_TestNode.m_description._M_string_length = 0;
  pTVar1[1].super_TestCase.super_TestNode.m_description.field_2._M_allocated_capacity = 0;
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar1);
  pTVar1 = (TestCaseBase *)operator_new(0x310);
  TestCaseBase::TestCaseBase
            (pTVar1,(this->super_TestCaseGroupBase).m_context,extParam,"invariance_rule5",
             "Verifies conformance with fifth invariance rule");
  pTVar1[1].super_TestCase.super_TestNode._vptr_TestNode = (_func_int **)0x0;
  *(undefined4 *)&pTVar1[1].super_TestCase.super_TestNode.m_testCtx = 0;
  pTVar1[1].super_TestCase.super_TestNode.m_name._M_dataplus._M_p = (pointer)0x0;
  pTVar1[1].super_TestCase.super_TestNode.m_name._M_string_length = 0;
  pTVar1[1].super_TestCase.super_TestNode.m_name.field_2._M_allocated_capacity = 0;
  *(undefined8 *)((long)&pTVar1[1].super_TestCase.super_TestNode.m_name.field_2 + 8) = 0;
  (pTVar1->super_TestCase).super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__TessellationShaderInvarianceRule5Test_021593e8;
  pTVar1[1].super_TestCase.super_TestNode.m_description._M_dataplus._M_p = (pointer)0x0;
  pTVar1[1].super_TestCase.super_TestNode.m_description._M_string_length = 0;
  pTVar1[1].super_TestCase.super_TestNode.m_description.field_2._M_allocated_capacity = 0;
  *(undefined8 *)((long)&pTVar1[1].super_TestCase.super_TestNode.m_description.field_2 + 8) = 0;
  *(undefined8 *)&pTVar1[1].super_TestCase.super_TestNode.m_nodeType = 0;
  pTVar1[1].super_TestCase.super_TestNode.m_children.
  super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar1);
  pTVar1 = (TestCaseBase *)operator_new(0x310);
  TestCaseBase::TestCaseBase
            (pTVar1,(this->super_TestCaseGroupBase).m_context,extParam,"invariance_rule6",
             "Verifies conformance with sixth invariance rule");
  pTVar1[1].super_TestCase.super_TestNode._vptr_TestNode = (_func_int **)0x0;
  *(undefined4 *)&pTVar1[1].super_TestCase.super_TestNode.m_testCtx = 0;
  pTVar1[1].super_TestCase.super_TestNode.m_name._M_dataplus._M_p = (pointer)0x0;
  pTVar1[1].super_TestCase.super_TestNode.m_name._M_string_length = 0;
  pTVar1[1].super_TestCase.super_TestNode.m_name.field_2._M_allocated_capacity = 0;
  *(undefined8 *)((long)&pTVar1[1].super_TestCase.super_TestNode.m_name.field_2 + 8) = 0;
  (pTVar1->super_TestCase).super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__TessellationShaderInvarianceRule6Test_02159488;
  pTVar1[1].super_TestCase.super_TestNode.m_description._M_dataplus._M_p = (pointer)0x0;
  pTVar1[1].super_TestCase.super_TestNode.m_description._M_string_length = 0;
  pTVar1[1].super_TestCase.super_TestNode.m_description.field_2._M_allocated_capacity = 0;
  *(undefined8 *)((long)&pTVar1[1].super_TestCase.super_TestNode.m_description.field_2 + 8) = 0;
  *(undefined8 *)&pTVar1[1].super_TestCase.super_TestNode.m_nodeType = 0;
  pTVar1[1].super_TestCase.super_TestNode.m_children.
  super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar1);
  pTVar1 = (TestCaseBase *)operator_new(0x310);
  TestCaseBase::TestCaseBase
            (pTVar1,(this->super_TestCaseGroupBase).m_context,extParam,"invariance_rule7",
             "Verifies conformance with seventh invariance rule");
  pTVar1[1].super_TestCase.super_TestNode._vptr_TestNode = (_func_int **)0x0;
  *(undefined4 *)&pTVar1[1].super_TestCase.super_TestNode.m_testCtx = 0;
  pTVar1[1].super_TestCase.super_TestNode.m_name._M_dataplus._M_p = (pointer)0x0;
  pTVar1[1].super_TestCase.super_TestNode.m_name._M_string_length = 0;
  pTVar1[1].super_TestCase.super_TestNode.m_name.field_2._M_allocated_capacity = 0;
  *(undefined8 *)((long)&pTVar1[1].super_TestCase.super_TestNode.m_name.field_2 + 8) = 0;
  (pTVar1->super_TestCase).super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__TessellationShaderInvarianceRule7Test_02159528;
  pTVar1[1].super_TestCase.super_TestNode.m_description._M_dataplus._M_p = (pointer)0x0;
  pTVar1[1].super_TestCase.super_TestNode.m_description._M_string_length = 0;
  pTVar1[1].super_TestCase.super_TestNode.m_description.field_2._M_allocated_capacity = 0;
  *(undefined8 *)((long)&pTVar1[1].super_TestCase.super_TestNode.m_description.field_2 + 8) = 0;
  *(undefined8 *)&pTVar1[1].super_TestCase.super_TestNode.m_nodeType = 0;
  pTVar1[1].super_TestCase.super_TestNode.m_children.
  super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar1);
  return extraout_EAX;
}

Assistant:

void TessellationShaderInvarianceTests::init(void)
{
	addChild(new glcts::TessellationShaderInvarianceRule1Test(m_context, m_extParams));
	addChild(new glcts::TessellationShaderInvarianceRule2Test(m_context, m_extParams));
	addChild(new glcts::TessellationShaderInvarianceRule3Test(m_context, m_extParams));
	addChild(new glcts::TessellationShaderInvarianceRule4Test(m_context, m_extParams));
	addChild(new glcts::TessellationShaderInvarianceRule5Test(m_context, m_extParams));
	addChild(new glcts::TessellationShaderInvarianceRule6Test(m_context, m_extParams));
	addChild(new glcts::TessellationShaderInvarianceRule7Test(m_context, m_extParams));
}